

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

TEXTURE_FORMAT Diligent::SRGBFormatToUnorm(TEXTURE_FORMAT Fmt)

{
  TEXTURE_FORMAT local_a;
  TEXTURE_FORMAT Fmt_local;
  
  switch(Fmt) {
  case TEX_FORMAT_RGBA8_UNORM_SRGB:
    local_a = TEX_FORMAT_RGBA8_UNORM;
    break;
  default:
    local_a = Fmt;
    break;
  case TEX_FORMAT_BC1_UNORM_SRGB:
    local_a = TEX_FORMAT_BC1_UNORM;
    break;
  case TEX_FORMAT_BC2_UNORM_SRGB:
    local_a = TEX_FORMAT_BC2_UNORM;
    break;
  case TEX_FORMAT_BC3_UNORM_SRGB:
    local_a = TEX_FORMAT_BC3_UNORM;
    break;
  case TEX_FORMAT_BGRA8_UNORM_SRGB:
    local_a = TEX_FORMAT_BGRA8_UNORM;
    break;
  case TEX_FORMAT_BGRX8_UNORM_SRGB:
    local_a = TEX_FORMAT_BGRX8_UNORM;
    break;
  case TEX_FORMAT_BC7_UNORM_SRGB:
    local_a = TEX_FORMAT_BC7_UNORM;
    break;
  case TEX_FORMAT_ETC2_RGB8_UNORM_SRGB:
    local_a = TEX_FORMAT_ETC2_RGB8_UNORM;
    break;
  case TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB:
    local_a = TEX_FORMAT_ETC2_RGB8A1_UNORM;
    break;
  case TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB:
    local_a = TEX_FORMAT_ETC2_RGBA8_UNORM;
  }
  return local_a;
}

Assistant:

TEXTURE_FORMAT SRGBFormatToUnorm(TEXTURE_FORMAT Fmt)
{
    static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please update the switch below to handle the new texture format, if needed");
    switch (Fmt)
    {
        case TEX_FORMAT_RGBA8_UNORM_SRGB:
            return TEX_FORMAT_RGBA8_UNORM;

        case TEX_FORMAT_BC1_UNORM_SRGB:
            return TEX_FORMAT_BC1_UNORM;

        case TEX_FORMAT_BC2_UNORM_SRGB:
            return TEX_FORMAT_BC2_UNORM;

        case TEX_FORMAT_BC3_UNORM_SRGB:
            return TEX_FORMAT_BC3_UNORM;

        case TEX_FORMAT_BGRA8_UNORM_SRGB:
            return TEX_FORMAT_BGRA8_UNORM;

        case TEX_FORMAT_BGRX8_UNORM_SRGB:
            return TEX_FORMAT_BGRX8_UNORM;

        case TEX_FORMAT_BC7_UNORM_SRGB:
            return TEX_FORMAT_BC7_UNORM;

        case TEX_FORMAT_ETC2_RGB8_UNORM_SRGB:
            return TEX_FORMAT_ETC2_RGB8_UNORM;

        case TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB:
            return TEX_FORMAT_ETC2_RGB8A1_UNORM;

        case TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB:
            return TEX_FORMAT_ETC2_RGBA8_UNORM;

        default:
            return Fmt;
    }
}